

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::PickRange::backward_impl
          (PickRange *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  Dim *in_RCX;
  long in_RDI;
  int in_R8D;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  Tensor *in_stack_ffffffffffffff68;
  Index in_stack_ffffffffffffff70;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff78;
  
  if (in_R8D != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                  ,0x64b,
                  "virtual void cnn::PickRange::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  uVar1 = Dim::rows(in_RCX);
  if (uVar1 == *(int *)(in_RDI + 0x54) - *(int *)(in_RDI + 0x50)) {
    uVar1 = Dim::cols(in_RCX);
    if (uVar1 == 1) {
      Tensor::operator*(in_stack_ffffffffffffff68);
      Tensor::operator*(in_stack_ffffffffffffff68);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      block<unsigned_int,int>
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (Index)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                 in_stack_ffffffffffffff60);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>>
      ::operator+=((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                    *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
      return;
    }
    __assert_fail("dEdf.d.cols() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                  ,0x64d,
                  "virtual void cnn::PickRange::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  __assert_fail("int(dEdf.d.rows()) == int(end-start)",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                ,0x64c,
                "virtual void cnn::PickRange::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void PickRange::backward_impl(const vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  assert(i == 0);
  assert(int(dEdf.d.rows()) == int(end-start));
  assert(dEdf.d.cols() == 1);
#if HAVE_CUDA
  CUBLAS_CHECK(cublasSaxpy(cublas_handle, end-start, kSCALAR_ONE, dEdf.v, 1, &dEdxi.v[start], 1));
#else
  (*dEdxi).block(start, 0, end-start, 1) += (*dEdf);
#endif
}